

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O3

DWORD PROCGetProcessIDFromHandle(HANDLE hProcess)

{
  int iVar1;
  CPalThread *pCVar2;
  DWORD DVar3;
  undefined8 *local_38;
  IDataLock *pDataLock;
  CProcProcessLocalData *pLocalData;
  IPalObject *pobjProcess;
  
  pLocalData = (CProcProcessLocalData *)0x0;
  pCVar2 = (CPalThread *)pthread_getspecific(CorUnix::thObjKey);
  if (pCVar2 == (CPalThread *)0x0) {
    pCVar2 = CreateCurrentThreadData();
  }
  DVar3 = gPID;
  if ((undefined1 *)hProcess != &DAT_ffffff01) {
    iVar1 = (**(code **)(*CorUnix::g_pObjectManager + 0x28))
                      (CorUnix::g_pObjectManager,pCVar2,hProcess,&aotProcess,0,&pLocalData);
    DVar3 = 0;
    if (iVar1 == 0) {
      DVar3 = 0;
      iVar1 = (**(code **)(*(long *)pLocalData + 0x18))(pLocalData,pCVar2,0,&local_38,&pDataLock);
      if (iVar1 == 0) {
        DVar3 = *(DWORD *)&pDataLock->_vptr_IDataLock;
        (**(code **)*local_38)(local_38,pCVar2,0);
      }
      (**(code **)(*(long *)pLocalData + 0x40))(pLocalData,pCVar2);
    }
  }
  return DVar3;
}

Assistant:

DWORD
PROCGetProcessIDFromHandle(
        HANDLE hProcess)
{
    PAL_ERROR palError;
    IPalObject *pobjProcess = NULL;
    CPalThread *pThread = InternalGetCurrentThread();

    DWORD dwProcessId = 0;

    if (hPseudoCurrentProcess == hProcess)
    {
        dwProcessId = gPID;
        goto PROCGetProcessIDFromHandleExit;
    }


    palError = g_pObjectManager->ReferenceObjectByHandle(
        pThread,
        hProcess,
        &aotProcess,
        0,
        &pobjProcess
        );

    if (NO_ERROR == palError)
    {
        IDataLock *pDataLock;
        CProcProcessLocalData *pLocalData;

        palError = pobjProcess->GetProcessLocalData(
            pThread,
            ReadLock,
            &pDataLock,
            reinterpret_cast<void **>(&pLocalData)
            );

        if (NO_ERROR == palError)
        {
            dwProcessId = pLocalData->dwProcessId;
            pDataLock->ReleaseLock(pThread, FALSE);
        }

        pobjProcess->ReleaseReference(pThread);
    }

PROCGetProcessIDFromHandleExit:

    return dwProcessId;
}